

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshifter.cpp
# Opt level: O1

void anon_unknown.dwarf_178dea::Fshifter_setParamf(EffectProps *props,ALenum param,float val)

{
  effect_exception *this;
  
  if (param == 1) {
    if ((0.0 <= val) && (val <= 24000.0)) {
      (props->Reverb).Density = val;
      return;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Frequency shifter frequency out of range");
  }
  else {
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid frequency shifter float property 0x%04x",(ulong)(uint)param);
  }
  __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void Fshifter_setParamf(EffectProps *props, ALenum param, float val)
{
    switch(param)
    {
    case AL_FREQUENCY_SHIFTER_FREQUENCY:
        if(!(val >= AL_FREQUENCY_SHIFTER_MIN_FREQUENCY && val <= AL_FREQUENCY_SHIFTER_MAX_FREQUENCY))
            throw effect_exception{AL_INVALID_VALUE, "Frequency shifter frequency out of range"};
        props->Fshifter.Frequency = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid frequency shifter float property 0x%04x",
            param};
    }
}